

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O2

void anon_unknown.dwarf_6e813::getDerivatives
               (vector<int,_std::allocator<int>_> *image,vector<int,_std::allocator<int>_> *first,
               vector<int,_std::allocator<int>_> *second)

{
  pointer piVar1;
  
  piVar1 = (image->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  std::
  transform<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::minus<int>>
            (piVar1 + 1,
             (image->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish,piVar1,
             (first->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start);
  piVar1 = (first->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  std::
  transform<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::minus<int>>
            (piVar1 + 1,
             (first->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish,piVar1,
             (second->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start + 1);
  return;
}

Assistant:

void getDerivatives( const std::vector < int > & image, std::vector < int > & first, std::vector < int > & second )
    {
        // input array range is [0; n)
        // first deriviative range is [0; n - 1)
        // second deriviative range is [1; n - 1)
        std::transform( image.begin() + 1u, image.end(), image.begin(), first.begin(), std::minus<int>() );
        std::transform( first.begin() + 1u, first.end(), first.begin(), second.begin() + 1u, std::minus<int>() );
    }